

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idec_dec.c
# Opt level: O0

VP8StatusCode DecodeVP8LHeader(WebPIDecoder *idec)

{
  VP8StatusCode *pVVar1;
  ulong uVar2;
  VP8StatusCode VVar3;
  int iVar4;
  WebPIDecoder *idec_00;
  WebPDecoderOptions *in_RDI;
  size_t curr_size;
  WebPDecBuffer *output;
  WebPDecParams *params;
  VP8LDecoder *dec;
  VP8Io *io;
  WebPIDecoder *idec_01;
  VP8LDecoder *dec_00;
  WebPDecBuffer *buffer;
  int in_stack_fffffffffffffffc;
  
  buffer = (WebPDecBuffer *)(in_RDI[1].pad + 1);
  pVVar1 = *(VP8StatusCode **)&in_RDI[1].alpha_dithering_strength;
  dec_00 = (VP8LDecoder *)&in_RDI->use_cropping;
  idec_01 = *(WebPIDecoder **)dec_00;
  idec_00 = (WebPIDecoder *)MemDataSize((MemBuffer_conflict *)(in_RDI[3].pad + 3));
  uVar2._0_4_ = in_RDI[6].crop_height;
  uVar2._4_4_ = in_RDI[6].use_scaling;
  if (idec_00 < (WebPIDecoder *)(uVar2 >> 3)) {
    *pVVar1 = VP8_STATUS_SUSPENDED;
    VVar3 = ErrorStatusLossless(idec_00,VP8_STATUS_OK);
  }
  else {
    iVar4 = VP8LDecodeHeader(dec_00,(VP8Io *)idec_01);
    if (iVar4 == 0) {
      if ((*pVVar1 == VP8_STATUS_BITSTREAM_ERROR) &&
         (idec_00 < *(WebPIDecoder **)&in_RDI[6].crop_height)) {
        *pVVar1 = VP8_STATUS_SUSPENDED;
      }
      VVar3 = ErrorStatusLossless(idec_00,VP8_STATUS_OK);
    }
    else {
      VVar3 = WebPAllocateDecBuffer((int)curr_size,in_stack_fffffffffffffffc,in_RDI,buffer);
      *pVVar1 = VVar3;
      if (*pVVar1 == VP8_STATUS_OK) {
        in_RDI->bypass_filtering = 5;
        VVar3 = VP8_STATUS_OK;
      }
      else {
        VVar3 = IDecError(idec_01,(VP8StatusCode)((ulong)idec_00 >> 0x20));
      }
    }
  }
  return VVar3;
}

Assistant:

static VP8StatusCode DecodeVP8LHeader(WebPIDecoder* const idec) {
  VP8Io* const io = &idec->io_;
  VP8LDecoder* const dec = (VP8LDecoder*)idec->dec_;
  const WebPDecParams* const params = &idec->params_;
  WebPDecBuffer* const output = params->output;
  size_t curr_size = MemDataSize(&idec->mem_);
  assert(idec->is_lossless_);

  // Wait until there's enough data for decoding header.
  if (curr_size < (idec->chunk_size_ >> 3)) {
    dec->status_ = VP8_STATUS_SUSPENDED;
    return ErrorStatusLossless(idec, dec->status_);
  }

  if (!VP8LDecodeHeader(dec, io)) {
    if (dec->status_ == VP8_STATUS_BITSTREAM_ERROR &&
        curr_size < idec->chunk_size_) {
      dec->status_ = VP8_STATUS_SUSPENDED;
    }
    return ErrorStatusLossless(idec, dec->status_);
  }
  // Allocate/verify output buffer now.
  dec->status_ = WebPAllocateDecBuffer(io->width, io->height, params->options,
                                       output);
  if (dec->status_ != VP8_STATUS_OK) {
    return IDecError(idec, dec->status_);
  }

  idec->state_ = STATE_VP8L_DATA;
  return VP8_STATUS_OK;
}